

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_object_list_add(JSContext *ctx,JSObjectList *s,JSObject *obj)

{
  JSObjectListEntry *pJVar1;
  uint32_t *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = s->object_count;
  if (s->object_size <= (int)uVar6) {
    iVar4 = js_realloc_array(ctx,&s->object_tab,0x10,&s->object_size,uVar6 + 1);
    if (iVar4 != 0) {
      return -1;
    }
    uVar6 = s->object_count;
  }
  uVar5 = uVar6 + 1;
  uVar3 = s->hash_size;
  if (uVar3 <= uVar5) {
    uVar5 = 4;
    if (4 < uVar3) {
      uVar5 = uVar3;
    }
    do {
      uVar3 = uVar5;
      uVar5 = uVar3 * 2;
    } while (uVar3 <= uVar6);
    iVar4 = js_object_list_resize_hash(ctx,s,uVar3);
    if (iVar4 != 0) {
      return -1;
    }
    uVar6 = s->object_count;
    uVar3 = s->hash_size;
    uVar5 = uVar6 + 1;
  }
  pJVar1 = s->object_tab;
  s->object_count = uVar5;
  uVar5 = (int)obj * 0xc5b & uVar3 - 1;
  pJVar1[(int)uVar6].obj = obj;
  puVar2 = s->hash_table;
  pJVar1[(int)uVar6].hash_next = puVar2[uVar5];
  puVar2[uVar5] = uVar6;
  return 0;
}

Assistant:

static int js_object_list_add(JSContext *ctx, JSObjectList *s, JSObject *obj)
{
    JSObjectListEntry *e;
    uint32_t h, new_hash_size;
    
    if (js_resize_array(ctx, (void *)&s->object_tab,
                        sizeof(s->object_tab[0]),
                        &s->object_size, s->object_count + 1))
        return -1;
    if (unlikely((s->object_count + 1) >= s->hash_size)) {
        new_hash_size = max_uint32(s->hash_size, 4);
        while (new_hash_size <= s->object_count)
            new_hash_size *= 2;
        if (js_object_list_resize_hash(ctx, s, new_hash_size))
            return -1;
    }
    e = &s->object_tab[s->object_count++];
    h = js_object_list_get_hash(obj, s->hash_size); 
    e->obj = obj;
    e->hash_next = s->hash_table[h];
    s->hash_table[h] = s->object_count - 1;
    return 0;
}